

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svector.cc
# Opt level: O2

double * __thiscall fizplex::SVector::operator[](SVector *this,size_t ind)

{
  double *pdVar1;
  double *pdVar2;
  pointer pNVar3;
  long lVar4;
  double *pdVar5;
  
  pNVar3 = (this->values).
           super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = ((long)(this->values).
                 super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar3 >> 4) + 1;
  pdVar5 = &pNVar3[-1].value;
  do {
    lVar4 = lVar4 + -1;
    if (lVar4 == 0) {
      add_value(this,ind,0.0);
      return &(this->values).
              super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].value;
    }
    pdVar1 = pdVar5 + 2;
    pdVar2 = pdVar5 + 1;
    pdVar5 = pdVar1;
  } while (*pdVar2 != (double)ind);
  return pdVar1;
}

Assistant:

double &SVector::operator[](size_t ind) {
  for (size_t i = 0; i < values.size(); ++i) {
    if (values[i].index == ind)
      return values[i].value;
  }
  add_value(ind, 0.0);
  return values.back().value;
}